

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-heavy-traffic-deadlock-bug.c
# Opt level: O1

void do_writes_and_reads(uv_stream_t *handle)

{
  int iVar1;
  void *pvVar2;
  undefined8 uVar3;
  undefined8 *extraout_RDX;
  long lVar4;
  long *__size;
  void *__s;
  long lVar5;
  undefined1 auVar6 [16];
  int64_t eval_a;
  uv_buf_t bufs [3];
  long lStack_178;
  long lStack_170;
  uv_stream_t uStack_168;
  uv_stream_t *puStack_80;
  long local_78;
  size_t local_70 [8];
  
  lVar4 = 0;
  bytes_written = 0;
  bytes_read = 0;
  do {
    puStack_80 = (uv_stream_t *)0x1a7ddf;
    pvVar2 = malloc(0x60c8);
    if (pvVar2 == (void *)0x0) {
      puStack_80 = (uv_stream_t *)0x1a7f25;
      do_writes_and_reads_cold_6();
LAB_001a7f25:
      puStack_80 = (uv_stream_t *)0x1a7f32;
      do_writes_and_reads_cold_1();
      goto LAB_001a7f32;
    }
    __s = (void *)((long)pvVar2 + 200);
    lVar5 = 8;
    do {
      puStack_80 = (uv_stream_t *)0x1a7e0d;
      memset(__s,0x2a,0x2000);
      puStack_80 = (uv_stream_t *)0x1a7e1a;
      auVar6 = uv_buf_init(__s,0x2000);
      *(long *)((long)local_70 + lVar5) = auVar6._0_8_;
      *(long *)((long)local_70 + lVar5 + 8U) = auVar6._8_8_;
      lVar5 = lVar5 + 0x10;
      __s = (void *)((long)__s + 3);
    } while (lVar5 != 0x38);
    puStack_80 = (uv_stream_t *)0x1a7e4c;
    iVar1 = uv_write(pvVar2,handle,local_70 + 1,3,write_cb);
    local_78 = (long)iVar1;
    local_70[0] = 0;
    if (local_78 != 0) goto LAB_001a7f25;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x100);
  puStack_80 = (uv_stream_t *)0x1a7e90;
  iVar1 = uv_read_start(handle,alloc_cb,read_cb);
  local_70[1] = (size_t)iVar1;
  local_78 = 0;
  if (local_70[1] == 0) {
    puStack_80 = (uv_stream_t *)0x1a7eb9;
    iVar1 = uv_run(handle->loop,0);
    local_70[1] = (size_t)iVar1;
    local_78 = 0;
    if (local_70[1] != 0) goto LAB_001a7f3f;
    local_70[1] = bytes_written;
    local_78 = 0x600000;
    if (bytes_written != 0x600000) goto LAB_001a7f4c;
    local_70[1] = bytes_read;
    local_78 = 0x600000;
    if (bytes_read == 0x600000) {
      return;
    }
  }
  else {
LAB_001a7f32:
    puStack_80 = (uv_stream_t *)0x1a7f3f;
    do_writes_and_reads_cold_2();
LAB_001a7f3f:
    puStack_80 = (uv_stream_t *)0x1a7f4c;
    do_writes_and_reads_cold_3();
LAB_001a7f4c:
    puStack_80 = (uv_stream_t *)0x1a7f59;
    do_writes_and_reads_cold_4();
  }
  puStack_80 = (uv_stream_t *)ipc_helper_heavy_traffic_deadlock_bug;
  do_writes_and_reads_cold_5();
  puStack_80 = handle;
  uVar3 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar3,&uStack_168,1);
  lStack_170 = (long)iVar1;
  lStack_178 = 0;
  if (lStack_170 == 0) {
    iVar1 = uv_pipe_open(&uStack_168,0);
    lStack_170 = (long)iVar1;
    lStack_178 = 0;
    if (lStack_170 == 0) {
      notify_parent_process();
      do_writes_and_reads(&uStack_168);
      uv_sleep(100);
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      lStack_170 = 0;
      uVar3 = uv_default_loop();
      iVar1 = uv_loop_close(uVar3);
      lStack_178 = (long)iVar1;
      if (lStack_170 == lStack_178) {
        uv_library_shutdown();
        return;
      }
      goto LAB_001a8064;
    }
  }
  else {
    ipc_helper_heavy_traffic_deadlock_bug_cold_1();
  }
  ipc_helper_heavy_traffic_deadlock_bug_cold_2();
LAB_001a8064:
  __size = &lStack_178;
  ipc_helper_heavy_traffic_deadlock_bug_cold_3();
  pvVar2 = malloc((size_t)__size);
  *extraout_RDX = pvVar2;
  extraout_RDX[1] = (long)(int)__size;
  return;
}

Assistant:

static void do_writes_and_reads(uv_stream_t* handle) {
  size_t i;
  int r;

  bytes_written = 0;
  bytes_read = 0;

  for (i = 0; i < NUM_WRITES; i++) {
    do_write(handle);
  }

  r = uv_read_start(handle, alloc_cb, read_cb);
  ASSERT_OK(r);

  r = uv_run(handle->loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(bytes_written, XFER_SIZE);
  ASSERT_EQ(bytes_read, XFER_SIZE);
}